

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O0

_Bool ecs_is_component_enabled_w_entity
                (ecs_world_t *world,ecs_entity_t entity,ecs_entity_t component)

{
  _Bool _Var1;
  int32_t iVar2;
  int iVar3;
  ecs_bitset_t *bs;
  int32_t index;
  ecs_type_t type;
  ecs_entity_t bs_id;
  ecs_table_t *table;
  ecs_entity_info_t info;
  ecs_entity_t component_local;
  ecs_entity_t entity_local;
  ecs_world_t *world_local;
  
  info._24_8_ = component;
  _Var1 = ecs_get_info(world,entity,(ecs_entity_info_t *)&table);
  if ((_Var1) && (info.record != (ecs_record_t *)0x0)) {
    iVar2 = ecs_type_index_of((ecs_type_t)(info.record)->table,
                              info._24_8_ & 0xffffffffffffff | 0xf400000000000000);
    if (iVar2 == -1) {
      world_local._7_1_ = ecs_has_entity(world,entity,info._24_8_);
    }
    else {
      iVar3 = iVar2 - *(int *)&info.record[7].field_0xc;
      _ecs_assert(-1 < iVar3,0xc,(char *)0x0,"index >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x90f);
      if (iVar3 < 0) {
        __assert_fail("index >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                      ,0x90f,
                      "_Bool ecs_is_component_enabled_w_entity(ecs_world_t *, ecs_entity_t, ecs_entity_t)"
                     );
      }
      _ecs_assert(info.table != (ecs_table_t *)0x0,0xc,(char *)0x0,"info.data != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x912);
      if (info.table == (ecs_table_t *)0x0) {
        __assert_fail("info.data != ((void*)0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                      ,0x912,
                      "_Bool ecs_is_component_enabled_w_entity(ecs_world_t *, ecs_entity_t, ecs_entity_t)"
                     );
      }
      world_local._7_1_ =
           ecs_bitset_get((ecs_bitset_t *)(&(info.table)->data->entities + (long)iVar3 * 2),
                          (int32_t)info.data);
    }
  }
  else {
    world_local._7_1_ = false;
  }
  return world_local._7_1_;
}

Assistant:

bool ecs_is_component_enabled_w_entity(
    ecs_world_t *world,
    ecs_entity_t entity,
    ecs_entity_t component)
{
    ecs_entity_info_t info;
    ecs_table_t *table;
    if (!ecs_get_info(world, entity, &info) || !(table = info.table)) {
        return false;
    }

    ecs_entity_t bs_id = (component & ECS_COMPONENT_MASK) | ECS_DISABLED;

    ecs_type_t type = table->type;
    int32_t index = ecs_type_index_of(type, bs_id);
    if (index == -1) {
        /* If table does not have DISABLED column for component, component is
         * always enabled, if the entity has it */
        return ecs_has_entity(world, entity, component);
    }

    index -= table->bs_column_offset;
    ecs_assert(index >= 0, ECS_INTERNAL_ERROR, NULL);

    /* Data cannot be NULl, since entity is stored in the table */
    ecs_assert(info.data != NULL, ECS_INTERNAL_ERROR, NULL);
    ecs_bitset_t *bs = &info.data->bs_columns[index].data;  

    return ecs_bitset_get(bs, info.row);
}